

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O3

uint8_t * Fossilize::encode_varint(uint8_t *buffer,uint32_t *words,size_t word_count)

{
  uint uVar1;
  size_t sVar2;
  byte bVar3;
  
  if (word_count != 0) {
    sVar2 = 0;
    do {
      uVar1 = words[sVar2];
      bVar3 = (byte)uVar1;
      if (uVar1 < 0x80) {
        *buffer = bVar3;
        buffer = buffer + 1;
      }
      else if (uVar1 < 0x4000) {
        *buffer = bVar3 | 0x80;
        buffer[1] = (byte)(uVar1 >> 7);
        buffer = buffer + 2;
      }
      else if (uVar1 < 0x200000) {
        *buffer = bVar3 | 0x80;
        buffer[1] = (byte)(uVar1 >> 7) | 0x80;
        buffer[2] = (byte)(uVar1 >> 0xe);
        buffer = buffer + 3;
      }
      else {
        *buffer = bVar3 | 0x80;
        buffer[1] = (byte)(uVar1 >> 7) | 0x80;
        buffer[2] = (byte)(uVar1 >> 0xe) | 0x80;
        bVar3 = (byte)(uVar1 >> 0x15);
        if (uVar1 < 0x10000000) {
          buffer[3] = bVar3;
          buffer = buffer + 4;
        }
        else {
          buffer[3] = bVar3 | 0x80;
          buffer[4] = (byte)(uVar1 >> 0x1c);
          buffer = buffer + 5;
        }
      }
      sVar2 = sVar2 + 1;
    } while (word_count != sVar2);
  }
  return buffer;
}

Assistant:

uint8_t *encode_varint(uint8_t *buffer, const uint32_t *words, size_t word_count)
{
	for (size_t i = 0; i < word_count; i++)
	{
		auto w = words[i];
		if (w < (1u << 7))
			*buffer++ = uint8_t(w);
		else if (w < (1u << 14))
		{
			*buffer++ = uint8_t(0x80u | ((w >> 0) & 0x7f));
			*buffer++ = uint8_t((w >> 7) & 0x7f);
		}
		else if (w < (1u << 21))
		{
			*buffer++ = uint8_t(0x80u | ((w >> 0) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 7) & 0x7f));
			*buffer++ = uint8_t((w >> 14) & 0x7f);
		}
		else if (w < (1u << 28))
		{
			*buffer++ = uint8_t(0x80u | ((w >> 0) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 7) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 14) & 0x7f));
			*buffer++ = uint8_t((w >> 21) & 0x7f);
		}
		else
		{
			*buffer++ = uint8_t(0x80u | ((w >> 0) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 7) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 14) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 21) & 0x7f));
			*buffer++ = uint8_t((w >> 28) & 0x7f);
		}
	}
	return buffer;
}